

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O2

string * test_sprintf<long_long,int>
                   (string *__return_storage_ptr__,string_view format,longlong *args,int *args_1)

{
  char *local_18;
  size_t local_10;
  
  local_10 = format.size_;
  local_18 = format.data_;
  fmt::v5::sprintf<fmt::v5::basic_string_view<char>,long_long,int>
            (__return_storage_ptr__,(v5 *)&local_18,(basic_string_view<char> *)args,
             (longlong *)args_1,args_1);
  return __return_storage_ptr__;
}

Assistant:

std::string test_sprintf(fmt::string_view format, const Args &... args) {
  return fmt::sprintf(format, args...);
}